

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_context.cc
# Opt level: O0

void __thiscall p2t::SweepContext::MeshClean(SweepContext *this,Triangle *triangle)

{
  bool bVar1;
  reference ppTVar2;
  Triangle *local_60;
  int local_54;
  value_type pTStack_50;
  int i;
  Triangle *t;
  value_type local_38;
  undefined1 local_30 [8];
  vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> triangles;
  Triangle *triangle_local;
  SweepContext *this_local;
  
  triangles.super__Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)triangle;
  std::vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::vector
            ((vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> *)local_30);
  local_38 = (value_type)
             triangles.super__Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  std::vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::push_back
            ((vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> *)local_30,&local_38);
  while (bVar1 = std::vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::empty
                           ((vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> *)local_30),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    ppTVar2 = std::vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::back
                        ((vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> *)local_30);
    pTStack_50 = *ppTVar2;
    std::vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::pop_back
              ((vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> *)local_30);
    if ((pTStack_50 != (Triangle *)0x0) && (bVar1 = Triangle::IsInterior(pTStack_50), !bVar1)) {
      Triangle::IsInterior(pTStack_50,true);
      std::vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::push_back
                (&this->triangles_,&stack0xffffffffffffffb0);
      for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
        if ((pTStack_50->constrained_edge[local_54] & 1U) == 0) {
          local_60 = Triangle::GetNeighbor(pTStack_50,local_54);
          std::vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::push_back
                    ((vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> *)local_30,&local_60
                    );
        }
      }
    }
  }
  std::vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::~vector
            ((vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> *)local_30);
  return;
}

Assistant:

void SweepContext::MeshClean(Triangle& triangle)
{
  std::vector<Triangle *> triangles;
  triangles.push_back(&triangle);

  while(!triangles.empty()){
	Triangle *t = triangles.back();
	triangles.pop_back();

    if (t != NULL && !t->IsInterior()) {
      t->IsInterior(true);
      triangles_.push_back(t);
      for (int i = 0; i < 3; i++) {
        if (!t->constrained_edge[i])
          triangles.push_back(t->GetNeighbor(i));
      }
    }
  }
}